

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

JavascriptProxy * Js::JavascriptProxy::UnwrapNestedProxies(JavascriptProxy *proxy)

{
  RecyclableObject *pRVar1;
  bool bVar2;
  RecyclableObject *in_RAX;
  JavascriptProxy *this;
  RecyclableObject *local_28;
  
  local_28 = in_RAX;
  while( true ) {
    this = proxy;
    bVar2 = IsRevoked(this);
    if (bVar2) {
      return this;
    }
    pRVar1 = (this->target).ptr;
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = pRVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
    bVar2 = VarIs<Js::JavascriptProxy>(local_28);
    if (!bVar2) break;
    proxy = UnsafeVarTo<Js::JavascriptProxy>(local_28);
    if (proxy == (JavascriptProxy *)0x0) {
      return this;
    }
  }
  return this;
}

Assistant:

const JavascriptProxy* JavascriptProxy::UnwrapNestedProxies(const JavascriptProxy* proxy)
    {
        // continue while we have a proxy that is not revoked
        while (!proxy->IsRevoked())
        {
            JavascriptProxy* nestedProxy = JavascriptOperators::TryFromVar<JavascriptProxy>(proxy->target);
            if (nestedProxy == nullptr)
            {
                break;
            }

            proxy = nestedProxy;
        }

        return proxy;
    }